

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.cpp
# Opt level: O0

void license::generatePk(string *private_include,string *public_include)

{
  pointer pCVar1;
  ostream *poVar2;
  char *pcVar3;
  exception *e_2;
  string privKey;
  exception *e_1;
  string pubKey;
  exception *e;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> local_20;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> cryptoHlpr;
  string *public_include_local;
  string *private_include_local;
  
  cryptoHlpr._M_t.
  super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>._M_t.
  super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>.
  super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl =
       (__uniq_ptr_data<license::CryptoHelper,_std::default_delete<license::CryptoHelper>,_true,_true>
        )(__uniq_ptr_data<license::CryptoHelper,_std::default_delete<license::CryptoHelper>,_true,_true>
          )public_include;
  CryptoHelper::getInstance();
  pCVar1 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->(&local_20);
  (*(code *)**(undefined8 **)pCVar1)();
  pCVar1 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->(&local_20);
  (**(code **)(*(long *)pCVar1 + 0x10))(&e_1);
  write_pubkey_file(public_include,(string *)&e_1);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"PublicKey");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&e_1);
  pCVar1 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->(&local_20);
  (**(code **)(*(long *)pCVar1 + 8))(&e_2);
  write_privkey_file(private_include,(string *)&e_2);
  std::__cxx11::string::~string((string *)&e_2);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void generatePk(string private_include, string public_include) {
	unique_ptr<CryptoHelper> cryptoHlpr = CryptoHelper::getInstance();

	try {
		cryptoHlpr->generateKeyPair();
	} catch (exception &e) {
		cerr << endl << "Error generating key pair: " << e.what() << endl
				<< "aborting" << endl;
		exit(2);
	}

	try {
		const string pubKey = cryptoHlpr->exportPublicKey();
		write_pubkey_file(public_include, pubKey);
		// Print out the public key to console as a
		// hexadecimal string.
		cout << endl << "PublicKey" << pubKey.c_str() << endl;
	} catch (exception &e) {
		cerr << endl << "Error exporting public key: " << e.what() << endl
				<< "aborting." << endl;
		exit(4);
	}

	try {
		const string privKey = cryptoHlpr->exportPrivateKey();
		write_privkey_file(private_include, privKey);
	} catch (exception &e) {
		cerr << endl << "Error exporting private key: " << e.what() << endl
				<< "aborting" << endl;
		exit(5);
	}

	return;
}